

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

HMODULE LOADRegisterLibraryDirect(void *dl_handle,LPCSTR libraryNameOrPath,BOOL fDynamic)

{
  BOOL BVar1;
  LPWSTR pWVar2;
  PDLLMAIN p_Var3;
  code *pcVar4;
  MODSTRUCT *pMVar5;
  int *piVar6;
  undefined8 uVar7;
  MODSTRUCT *module;
  char *pcVar8;
  
  if (dl_handle == (void *)0x0) {
    pcVar8 = "dl_handle != nullptr";
    uVar7 = 0x5ac;
LAB_0012cdf3:
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,uVar7,pcVar8,"");
    fflush(_stderr);
    abort();
  }
  if (libraryNameOrPath == (LPCSTR)0x0) {
    pcVar8 = "libraryNameOrPath != nullptr";
    uVar7 = 0x5ad;
    goto LAB_0012cdf3;
  }
  if (*libraryNameOrPath == '\0') {
    pcVar8 = "libraryNameOrPath[0] != \'\\0\'";
    uVar7 = 0x5ae;
    goto LAB_0012cdf3;
  }
  module = &exe_module;
  do {
    if (module->dl_handle == dl_handle) {
      if (!PAL_InitializeChakraCoreCalled) goto LAB_0012cd69;
      if (module->refcount != -1) {
        module->refcount = module->refcount + 1;
      }
      dlclose(dl_handle);
      p_Var3 = module->pDllMain;
      goto LAB_0012cc92;
    }
    module = module->next;
  } while (module != &exe_module);
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012cd69;
  module = (MODSTRUCT *)CorUnix::InternalMalloc(0x40);
  if (module == (_MODSTRUCT *)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cd69;
    piVar6 = __errno_location();
    strerror(*piVar6);
  }
  else {
    pWVar2 = UTIL_MBToWC_Alloc(libraryNameOrPath,-1);
    if (pWVar2 != (LPWSTR)0x0) {
      module->dl_handle = dl_handle;
      module->refcount = 1;
      module->threadLibCalls = 1;
      module->self = module;
      module->hinstance = (HINSTANCE)0x0;
      module->pDllMain = (PDLLMAIN)0x0;
      module->next = (_MODSTRUCT *)0x0;
      module->prev = (_MODSTRUCT *)0x0;
      module->lib_name = pWVar2;
      p_Var3 = (PDLLMAIN)dlsym(dl_handle,"DllMain");
      module->pDllMain = p_Var3;
      module->prev = exe_module.prev;
      module->next = &exe_module;
      (exe_module.prev)->next = module;
      exe_module.prev = module;
LAB_0012cc92:
      if (p_Var3 == (PDLLMAIN)0x0) {
        if (PAL_InitializeChakraCoreCalled != false) {
          return module;
        }
      }
      else if (PAL_InitializeChakraCoreCalled != false) {
        if (module->hinstance == (HINSTANCE)0x0) {
          pcVar4 = (code *)dlsym(module->dl_handle,"PAL_RegisterModule");
          pMVar5 = module;
          if (pcVar4 != (code *)0x0) {
            pMVar5 = (MODSTRUCT *)(*pcVar4)(libraryNameOrPath);
          }
          module->hinstance = pMVar5;
        }
        BVar1 = LOADCallDllMainSafe(module,1,(LPVOID)-(ulong)(fDynamic == 0));
        if (BVar1 != 0) {
          return module;
        }
        if (PAL_InitializeChakraCoreCalled != false) {
          module->pDllMain = (PDLLMAIN)0x0;
          FreeLibrary(module);
          SetLastError(0x45a);
          return (HMODULE)0x0;
        }
      }
      goto LAB_0012cd69;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012cd69;
    CorUnix::InternalFree(module);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    SetLastError(8);
    dlclose(dl_handle);
    return (HMODULE)0x0;
  }
LAB_0012cd69:
  abort();
}

Assistant:

static HMODULE LOADRegisterLibraryDirect(void *dl_handle, LPCSTR libraryNameOrPath, BOOL fDynamic)
{
    MODSTRUCT *module = LOADAddModule(dl_handle, libraryNameOrPath);
    if (module == nullptr)
    {
        return nullptr;
    }

    /* If the module contains a DllMain, call it. */
    if (module->pDllMain)
    {
        TRACE("Calling DllMain (%p) for module %S\n",
            module->pDllMain,
            module->lib_name ? module->lib_name : W16_NULLSTRING);

        if (nullptr == module->hinstance)
        {
            PREGISTER_MODULE registerModule = (PREGISTER_MODULE)dlsym(module->dl_handle, "PAL_RegisterModule");
            if (registerModule != nullptr)
            {
                module->hinstance = registerModule(libraryNameOrPath);
            }
            else
            {
                // If the target module doesn't have the PAL_RegisterModule export, then use this PAL's
                // module handle assuming that the target module is referencing this PAL's exported
                // functions on said handle.
                module->hinstance = (HINSTANCE)module;
            }
        }

        BOOL dllMainRetVal = LOADCallDllMainSafe(module, DLL_PROCESS_ATTACH, fDynamic ? nullptr : (LPVOID)-1);

        // If DlMain(DLL_PROCESS_ATTACH) returns FALSE, we must immediately unload the module
        if (!dllMainRetVal)
        {
            ERROR("DllMain returned FALSE; unloading module.\n");
            module->pDllMain = nullptr;
            FreeLibrary((HMODULE)module);
            SetLastError(ERROR_DLL_INIT_FAILED);
            module = nullptr;
        }
    }
    else
    {
        TRACE("Module does not contain a DllMain function.\n");
    }

    return module;
}